

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O1

void __thiscall fasttext::Args::printQuantizationHelp(Args *this)

{
  ostream *poVar1;
  char *pcVar2;
  string local_78;
  string local_58;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nThe following arguments for quantization are optional:\n",0x38
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"  -cutoff             number of words and ngrams to retain [",
             0x3c);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  pcVar2 = "  -retrain            whether embeddings are finetuned if a cutoff is applied [";
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "  -retrain            whether embeddings are finetuned if a cutoff is applied [",0x4f)
  ;
  boolToString_abi_cxx11_(&local_38,(Args *)pcVar2,this->retrain);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  pcVar2 = "  -qnorm              whether the norm is quantized separately [";
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -qnorm              whether the norm is quantized separately [",0x40);
  boolToString_abi_cxx11_(&local_58,(Args *)pcVar2,this->qnorm);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  pcVar2 = "  -qout               whether the classifier is quantized [";
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -qout               whether the classifier is quantized [",0x3b);
  boolToString_abi_cxx11_(&local_78,(Args *)pcVar2,this->qout);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -dsub               size of each sub-vector [",0x2f);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Args::printQuantizationHelp() {
  std::cerr
      << "\nThe following arguments for quantization are optional:\n"
      << "  -cutoff             number of words and ngrams to retain ["
      << cutoff << "]\n"
      << "  -retrain            whether embeddings are finetuned if a cutoff is applied ["
      << boolToString(retrain) << "]\n"
      << "  -qnorm              whether the norm is quantized separately ["
      << boolToString(qnorm) << "]\n"
      << "  -qout               whether the classifier is quantized ["
      << boolToString(qout) << "]\n"
      << "  -dsub               size of each sub-vector [" << dsub << "]\n";
}